

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O1

int __thiscall
capnp::TwoPartyServer::accept(TwoPartyServer *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined8 uVar1;
  undefined4 in_register_00000034;
  Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> OVar2;
  Promise<void> promise;
  Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> connectionState;
  undefined1 local_28 [16];
  _func_int **local_18;
  EventLoop *local_10;
  
  local_28._0_8_ = &kj::NullDisposer::instance;
  local_28._8_8_ = __addr;
  OVar2 = kj::
          heap<capnp::TwoPartyServer::AcceptedConnection,capnp::TwoPartyServer&,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                    ((kj *)&local_18,(TwoPartyServer *)CONCAT44(in_register_00000034,__fd),
                     (Own<kj::AsyncIoStream,_std::nullptr_t> *)local_28);
  uVar1 = local_28._8_8_;
  if ((AcceptedConnection *)local_28._8_8_ != (AcceptedConnection *)0x0) {
    local_28._8_8_ = (AcceptedConnection *)0x0;
    (***(_func_int ***)local_28._0_8_)
              (local_28._0_8_,
               (long)(((Own<kj::AsyncIoStream,_std::nullptr_t> *)uVar1)->disposer[-2]._vptr_Disposer
                     + -9) +
               (long)((((TwoPartyVatNetwork *)(uVar1 + 0x10))->peerVatId).super_MessageBuilder.
                      arenaSpace + -1),OVar2.ptr);
  }
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_28);
  kj::Promise<void>::attach<kj::Own<capnp::TwoPartyServer::AcceptedConnection,decltype(nullptr)>>
            ((Promise<void> *)this,
             (Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> *)local_28);
  uVar1 = local_28._0_8_;
  if ((PromiseArenaMember *)local_28._0_8_ != (PromiseArenaMember *)0x0) {
    local_28._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  if (local_10 != (EventLoop *)0x0) {
    local_10 = (EventLoop *)0x0;
    (**(code **)*local_18)();
  }
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::accept(kj::AsyncIoStream& connection) {
  auto connectionState = kj::heap<AcceptedConnection>(*this,
      kj::Own<kj::AsyncIoStream>(&connection, kj::NullDisposer::instance));

  // Run the connection until disconnect.
  auto promise = connectionState->network.onDisconnect();
  return promise.attach(kj::mv(connectionState));
}